

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O0

void __thiscall PRM::Environment::Environment(Environment *this,int *_space_dimension)

{
  bool bVar1;
  iterator this_00;
  iterator _dimension;
  float *pfVar2;
  undefined4 *in_RSI;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *in_RDI;
  float *l;
  iterator __end2;
  iterator __begin2;
  vctr *__range2;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffa8;
  vctr *in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_ffffffffffffffd0;
  
  in_RDI->_M_current = (float *)&PTR___cxa_pure_virtual_001861b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x150370);
  *(undefined4 *)&in_RDI[1]._M_current = *in_RSI;
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffffd0._M_current,
             in_stack_ffffffffffffffc8);
  this_00 = std::vector<float,_std::allocator<float>_>::begin(in_stack_ffffffffffffffa8);
  _dimension = std::vector<float,_std::allocator<float>_>::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                               *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    in_stack_ffffffffffffffc0 =
         (vctr *)__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                 ::operator*((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                              *)&stack0xffffffffffffffd0);
    *(float *)&(in_stack_ffffffffffffffc0->super__Vector_base<float,_std::allocator<float>_>).
               _M_impl.super__Vector_impl_data._M_start = 10.0;
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
               &stack0xffffffffffffffd0);
  }
  pfVar2 = (float *)operator_new(0x20);
  RandomPointGenerator::RandomPointGenerator
            ((RandomPointGenerator *)this_00._M_current,(int *)_dimension._M_current,
             in_stack_ffffffffffffffc0);
  in_RDI[5]._M_current = pfVar2;
  return;
}

Assistant:

Environment(const int& _space_dimension)
        
        {
            space_dimension=_space_dimension;
            dimensions.resize(space_dimension);
            for (auto& l:dimensions){l = 10.0;}
            random = new RandomPointGenerator(space_dimension,dimensions);
            
            return;
        }